

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O1

DatatypeValidator * __thiscall
xercesc_4_0::TraverseSchema::getDatatypeValidator
          (TraverseSchema *this,XMLCh *uriStr,XMLCh *localPartStr)

{
  XMLBuffer *this_00;
  XMLCh XVar1;
  XMLCh XVar2;
  XMLSize_t XVar3;
  int iVar4;
  XMLCh *pXVar5;
  Grammar *pGVar6;
  DatatypeValidator *pDVar7;
  XMLCh *pXVar8;
  XMLCh *pXVar9;
  DatatypeValidatorFactory *this_01;
  
  if (uriStr == L"http://www.w3.org/2001/XMLSchema") {
LAB_0033bf78:
    this_01 = this->fDatatypeRegistry;
    goto LAB_0033bfdb;
  }
  pXVar5 = L"http://www.w3.org/2001/XMLSchema";
  pXVar9 = uriStr;
  if (uriStr == (XMLCh *)0x0) {
LAB_0033bedd:
    if (*pXVar5 == L'\0') goto LAB_0033bf78;
  }
  else {
    do {
      XVar1 = *pXVar9;
      if (XVar1 == L'\0') goto LAB_0033bedd;
      XVar2 = *pXVar5;
      pXVar5 = pXVar5 + 1;
      pXVar9 = pXVar9 + 1;
    } while (XVar1 == XVar2);
  }
  this_00 = &this->fBuffer;
  (this->fBuffer).fIndex = 0;
  if ((uriStr != (XMLCh *)0x0) && (*uriStr != L'\0')) {
    XMLBuffer::append(this_00,uriStr);
  }
  if ((this->fBuffer).fIndex == (this->fBuffer).fCapacity) {
    XMLBuffer::ensureCapacity(this_00,1);
  }
  XVar3 = (this->fBuffer).fIndex;
  (this->fBuffer).fIndex = XVar3 + 1;
  (this->fBuffer).fBuffer[XVar3] = L',';
  XMLBuffer::append(this_00,localPartStr);
  if ((uriStr == (XMLCh *)0x0) || (pXVar5 = this->fTargetNSURIString, pXVar5 == uriStr)) {
LAB_0033bfc6:
    localPartStr = (this->fBuffer).fBuffer;
    this_01 = this->fDatatypeRegistry;
    localPartStr[(this->fBuffer).fIndex] = L'\0';
  }
  else {
    pXVar9 = uriStr;
    pXVar8 = uriStr;
    if (pXVar5 == (XMLCh *)0x0) {
LAB_0033bf84:
      if (*pXVar9 == L'\0') goto LAB_0033bfc6;
    }
    else {
      do {
        XVar1 = *pXVar8;
        pXVar9 = pXVar5;
        if (XVar1 == L'\0') goto LAB_0033bf84;
        XVar2 = *pXVar5;
        pXVar5 = pXVar5 + 1;
        pXVar8 = pXVar8 + 1;
      } while (XVar1 == XVar2);
    }
    pGVar6 = GrammarResolver::getGrammar(this->fGrammarResolver,uriStr);
    if ((pGVar6 == (Grammar *)0x0) ||
       (iVar4 = (*(pGVar6->super_XSerializable)._vptr_XSerializable[5])(pGVar6), iVar4 != 1)) {
      return (DatatypeValidator *)0x0;
    }
    this_01 = (DatatypeValidatorFactory *)(pGVar6 + 0xf);
    localPartStr = (this->fBuffer).fBuffer;
    localPartStr[(this->fBuffer).fIndex] = L'\0';
  }
LAB_0033bfdb:
  pDVar7 = DatatypeValidatorFactory::getDatatypeValidator(this_01,localPartStr);
  return pDVar7;
}

Assistant:

DatatypeValidator*
TraverseSchema::getDatatypeValidator(const XMLCh* const uriStr,
                                     const XMLCh* const localPartStr) {

    DatatypeValidator* dv = 0;

    if (XMLString::equals(uriStr, SchemaSymbols::fgURI_SCHEMAFORSCHEMA)) {
        dv = fDatatypeRegistry->getDatatypeValidator(localPartStr);
    }
    else {

        fBuffer.set(uriStr);
        fBuffer.append(chComma);
        fBuffer.append(localPartStr);

        if ((uriStr) && !XMLString::equals(uriStr, fTargetNSURIString)) {

            Grammar* grammar = fGrammarResolver->getGrammar(uriStr);

            if (grammar && grammar->getGrammarType() == Grammar::SchemaGrammarType) {
                dv = ((SchemaGrammar*) grammar)->getDatatypeRegistry()->getDatatypeValidator(fBuffer.getRawBuffer());
            }
        }
        else {
            dv = fDatatypeRegistry->getDatatypeValidator(fBuffer.getRawBuffer());
        }
    }

    return dv;
}